

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O2

bool __thiscall
google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry::IsSubSymbolOf
          (SymbolEntry *this,DescriptorIndex *index,string_view super_symbol)

{
  pointer pEVar1;
  size_type sVar2;
  bool bVar3;
  string_view part;
  string_view part_00;
  anon_class_8_1_afd010da consume_part;
  anon_class_8_1_afd010da local_20;
  string_view local_18;
  
  local_18._M_str = super_symbol._M_str;
  local_18._M_len = super_symbol._M_len;
  local_20.super_symbol = &local_18;
  pEVar1 = (index->all_values_).
           super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  sVar2 = pEVar1[this->data_offset].encoded_package._M_string_length;
  if ((sVar2 != 0) &&
     (part._M_str = pEVar1[this->data_offset].encoded_package._M_dataplus._M_p, part._M_len = sVar2,
     bVar3 = IsSubSymbolOf::anon_class_8_1_afd010da::operator()(&local_20,part), !bVar3)) {
    return false;
  }
  part_00._M_str = (this->encoded_symbol)._M_dataplus._M_p;
  part_00._M_len = (this->encoded_symbol)._M_string_length;
  bVar3 = IsSubSymbolOf::anon_class_8_1_afd010da::operator()(&local_20,part_00);
  return bVar3;
}

Assistant:

bool IsSubSymbolOf(const DescriptorIndex& index,
                       absl::string_view super_symbol) const {
      const auto consume_part = [&](absl::string_view part) {
        if (!absl::ConsumePrefix(&super_symbol, part)) return false;
        return super_symbol.empty() || absl::ConsumePrefix(&super_symbol, ".");
      };
      if (auto p = package(index); !p.empty()) {
        if (!consume_part(p)) return false;
      }
      return consume_part(symbol(index));
    }